

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_str_get(void *arg,char *nm,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  int local_44;
  int rv;
  nni_ws *ws;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  char *nm_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if ((*(byte *)((long)arg + 0x51) & 1) == 0) {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    local_44 = nni_http_conn_getopt(*(nni_http_conn **)((long)arg + 0x9e8),nm,buf,szp,t);
    if (local_44 == 9) {
      local_44 = nni_getopt(ws_options,nm,arg,buf,szp,t);
    }
    if ((local_44 == 9) && (iVar1 = strncmp(nm,"ws:header:",10), iVar1 == 0)) {
      local_44 = ws_get_header((nni_ws *)arg,nm,buf,szp,t);
    }
    arg_local._4_4_ = local_44;
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    arg_local._4_4_ = 7;
  }
  return arg_local._4_4_;
}

Assistant:

static int
ws_str_get(void *arg, const char *nm, void *buf, size_t *szp, nni_type t)
{
	nni_ws *ws = arg;
	int     rv;

	nni_mtx_lock(&ws->mtx);
	if (ws->closed) {
		nni_mtx_unlock(&ws->mtx);
		return (NNG_ECLOSED);
	}
	nni_mtx_unlock(&ws->mtx);
	rv = nni_http_conn_getopt(ws->http, nm, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_getopt(ws_options, nm, ws, buf, szp, t);
	}
	// Check for generic headers...
	if (rv == NNG_ENOTSUP) {
		if (startswith(nm, NNG_OPT_WS_HEADER)) {
			rv = ws_get_header(ws, nm, buf, szp, t);
		}
	}
	return (rv);
}